

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_handle_graph.cpp
# Opt level: O0

size_t __thiscall
handlegraph::PathHandleGraph::get_step_count(PathHandleGraph *this,handle_t *handle)

{
  size_t count;
  handle_t *in_stack_00000028;
  PathHandleGraph *in_stack_00000030;
  
  for_each_step_on_handle<handlegraph::PathHandleGraph::get_step_count(handlegraph::handle_t_const&)const::__0>
            (in_stack_00000030,in_stack_00000028,(anon_class_8_1_a7c1402f *)this);
  return 0;
}

Assistant:

size_t PathHandleGraph::get_step_count(const handle_t& handle) const {
    size_t count = 0;
    for_each_step_on_handle(handle, [&](const step_handle_t& step) {
        ++count;
    });
    return count;
}